

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternSelection.cpp
# Opt level: O0

void __thiscall PatternSelection::moveTo(PatternSelection *this,PatternAnchor cursor)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int local_50;
  int end;
  undefined1 auStack_48 [4];
  int start;
  Iterator iter;
  PatternSelection *this_local;
  undefined8 local_14;
  PatternAnchor cursor_local;
  
  cursor_local.super_PatternCursorBase.row = cursor.super_PatternCursorBase.track;
  local_14 = cursor.super_PatternCursorBase._0_8_;
  iter.mEnd.super_PatternCursorBase._4_8_ = this;
  iterator((Iterator *)auStack_48,this);
  (this->mStart).super_PatternCursorBase.row = (int)auStack_48;
  (this->mStart).super_PatternCursorBase.column = start;
  (this->mStart).super_PatternCursorBase.track = iter.mStart.super_PatternCursorBase.row;
  (this->mEnd).super_PatternCursorBase.row = iter.mStart.super_PatternCursorBase.column;
  (this->mEnd).super_PatternCursorBase.column = iter.mStart.super_PatternCursorBase.track;
  (this->mEnd).super_PatternCursorBase.track = iter.mEnd.super_PatternCursorBase.row;
  iVar3 = (int)local_14;
  (this->mStart).super_PatternCursorBase.row = (int)local_14;
  iVar2 = Iterator::rows((Iterator *)auStack_48);
  (this->mEnd).super_PatternCursorBase.row = iVar3 + iVar2 + -1;
  iVar3 = Iterator::trackStart((Iterator *)auStack_48);
  iVar2 = Iterator::trackEnd((Iterator *)auStack_48);
  if (iVar3 == iVar2) {
    iVar3 = Iterator::columnStart((Iterator *)auStack_48);
    bVar1 = isEffect(iVar3);
    if (bVar1) {
      local_50 = 2;
      piVar5 = std::max<int>(&local_50,(int *)((long)&local_14 + 4));
      iVar3 = *piVar5;
      end = iVar3;
      iVar2 = Iterator::columnEnd((Iterator *)auStack_48);
      iVar4 = Iterator::columnStart((Iterator *)auStack_48);
      (this->mStart).super_PatternCursorBase.column = end;
      (this->mEnd).super_PatternCursorBase.column = (iVar3 + iVar2) - iVar4;
    }
  }
  iVar3 = cursor_local.super_PatternCursorBase.row;
  (this->mStart).super_PatternCursorBase.track = cursor_local.super_PatternCursorBase.row;
  iVar2 = Iterator::trackEnd((Iterator *)auStack_48);
  iVar4 = Iterator::trackStart((Iterator *)auStack_48);
  (this->mEnd).super_PatternCursorBase.track = (iVar3 + iVar2) - iVar4;
  return;
}

Assistant:

void PatternSelection::moveTo(PatternAnchor cursor) {
    auto iter = iterator();
    // normalize the selection coordinates
    mStart = iter.mStart;
    mEnd = iter.mEnd;

    // move to row
    mStart.row = cursor.row;
    mEnd.row = cursor.row + iter.rows() - 1;

    // if the selection is just effects, we can move it to another effect column
    // otherwise we can only move by tracks
    if (iter.trackStart() == iter.trackEnd()) {
        // within the same track
        if (isEffect(iter.columnStart())) {
            // only effects are selected, move by column
            auto start = std::max((int)PatternAnchor::SelectEffect1, cursor.column);
            int end = start + iter.columnEnd() - iter.columnStart();
            mStart.column = start;
            mEnd.column = end;
        }
    }

    // move to track
    mStart.track = cursor.track;
    mEnd.track = cursor.track + iter.trackEnd() - iter.trackStart();
}